

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  XmlWriter *this_00;
  string *rootName_00;
  pointer pPVar1;
  char *this_01;
  pointer pPVar2;
  ScopedElement e;
  string name;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  JunitReporter *local_60;
  ScopedElement local_58;
  string local_50;
  
  local_60 = this;
  trim(&local_50,&(sectionNode->stats).sectionInfo.name);
  if (rootName->_M_string_length != 0) {
    std::operator+(&local_80,rootName,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 8),&local_80,&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)(local_a8 + 8));
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a8 + 8),"testcase",(allocator<char> *)&local_80);
    this_00 = &local_60->xml;
    XmlWriter::scopedElement((XmlWriter *)&local_58,(string *)this_00);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a8 + 8),"classname",(allocator<char> *)&local_80);
      XmlWriter::writeAttribute(this_00,(string *)(local_a8 + 8),&local_50);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a8 + 8),"name",(allocator<char> *)&local_80);
      XmlWriter::writeAttribute<char[5]>(this_00,(string *)(local_a8 + 8),(char (*) [5])"root");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a8 + 8),"classname",(allocator<char> *)&local_80);
      XmlWriter::writeAttribute(this_00,(string *)(local_a8 + 8),className);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a8 + 8),"name",(allocator<char> *)&local_80);
      XmlWriter::writeAttribute(this_00,(string *)(local_a8 + 8),&local_50);
    }
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    this_01 = "time";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_a8 + 8),"time",(allocator<char> *)local_a8);
    Catch::toString_abi_cxx11_(&local_80,(Catch *)this_01,(sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(this_00,(string *)(local_a8 + 8),&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    writeAssertions(local_60,sectionNode);
    if ((sectionNode->stdOut)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a8 + 8),"system-out",&local_a9);
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_00);
      trim(&local_80,&sectionNode->stdOut);
      XmlWriter::writeText((XmlWriter *)local_a8,&local_80,false);
      std::__cxx11::string::~string((string *)&local_80);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_a8 + 8),"system-err",&local_a9);
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_00);
      trim(&local_80,&sectionNode->stdErr);
      XmlWriter::writeText((XmlWriter *)local_a8,&local_80,false);
      std::__cxx11::string::~string((string *)&local_80);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_58);
  }
  pPVar1 = (sectionNode->childSections).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  rootName_00 = (string *)(local_a8 + 8);
  for (pPVar2 = (sectionNode->childSections).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)rootName_00,"",(allocator<char> *)&local_80);
      writeSection(local_60,&local_50,rootName_00,pPVar2->m_p);
      std::__cxx11::string::~string((string *)rootName_00);
    }
    else {
      writeSection(local_60,className,&local_50,pPVar2->m_p);
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void writeSection(  std::string const& className,
                            std::string const& rootName,
                            SectionNode const& sectionNode ) {
            std::string name = trim( sectionNode.stats.sectionInfo.name );
            if( !rootName.empty() )
                name = rootName + "/" + name;

            if( !sectionNode.assertions.empty() ||
                !sectionNode.stdOut.empty() ||
                !sectionNode.stdErr.empty() ) {
                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                if( className.empty() ) {
                    xml.writeAttribute( "classname", name );
                    xml.writeAttribute( "name", "root" );
                }
                else {
                    xml.writeAttribute( "classname", className );
                    xml.writeAttribute( "name", name );
                }
                xml.writeAttribute( "time", Catch::toString( sectionNode.stats.durationInSeconds ) );

                writeAssertions( sectionNode );

                if( !sectionNode.stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), false );
                if( !sectionNode.stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), false );
            }
            for( SectionNode::ChildSections::const_iterator
                    it = sectionNode.childSections.begin(),
                    itEnd = sectionNode.childSections.end();
                    it != itEnd;
                    ++it )
                if( className.empty() )
                    writeSection( name, "", **it );
                else
                    writeSection( className, name, **it );
        }